

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

void event_track::set_evte(vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  size_type sVar5;
  reference pvVar6;
  size_type sVar7;
  size_type sVar8;
  allocator local_239;
  uint32_t or_size_7;
  uint32_t local_218;
  allocator local_211;
  uint32_t or_size_6;
  uint32_t local_1f0;
  allocator local_1e9;
  uint32_t or_size_5;
  uint32_t local_1c8;
  allocator local_1c1;
  uint32_t or_size_4;
  uint32_t local_1a0;
  allocator local_199;
  uint32_t or_size_3;
  uint32_t local_178;
  allocator local_171;
  uint32_t or_size_2;
  uint32_t local_150;
  allocator local_149;
  uint32_t or_size_1;
  ulong local_128;
  size_t i_1;
  size_t i;
  size_t l_diff;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_108;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_100;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  allocator<unsigned_char> local_c1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  uint32_t local_88;
  uint32_t or_size;
  allocator local_71;
  string local_70;
  ulong local_50;
  size_t k;
  vector<unsigned_char,_std::allocator<unsigned_char>_> l_last;
  vector<unsigned_char,_std::allocator<unsigned_char>_> l_first;
  uint32_t size_diff;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in_local;
  
  l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k);
  local_50 = 0;
  do {
    uVar1 = local_50;
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(moov_in);
    if (sVar5 - 0x10 <= uVar1) {
LAB_001083fc:
      if (l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(moov_in,sVar5);
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(moov_in);
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (moov_in,sVar5 + 1 + sVar7);
        for (i_1 = 0; sVar2 = i_1,
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k),
            sVar2 < sVar5; i_1 = i_1 + 1) {
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k,i_1);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(moov_in,pvVar6);
        }
        for (local_128 = 0; uVar1 = local_128,
            sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(moov_in),
            uVar1 < sVar5; local_128 = local_128 + 1) {
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (moov_in,local_128);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&or_size_1,"stsd",&local_149);
          bVar3 = compare_4cc((char *)pvVar6,(string *)&or_size_1);
          std::__cxx11::string::~string((string *)&or_size_1);
          std::allocator<char>::~allocator((allocator<char> *)&local_149);
          if (bVar3) {
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            uVar4 = anon_unknown.dwarf_19776::fmp4_read_uint32((char *)pvVar6);
            local_150 = uVar4 - l_first.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            anon_unknown.dwarf_19776::fmp4_write_uint32
                      (uVar4 - l_first.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                       (char *)pvVar6);
          }
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (moov_in,local_128);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&or_size_2,"stbl",&local_171);
          bVar3 = compare_4cc((char *)pvVar6,(string *)&or_size_2);
          std::__cxx11::string::~string((string *)&or_size_2);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
          if (bVar3) {
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            uVar4 = anon_unknown.dwarf_19776::fmp4_read_uint32((char *)pvVar6);
            local_178 = uVar4 - l_first.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            anon_unknown.dwarf_19776::fmp4_write_uint32
                      (uVar4 - l_first.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                       (char *)pvVar6);
          }
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (moov_in,local_128);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&or_size_3,"uri ",&local_199);
          bVar3 = compare_4cc((char *)pvVar6,(string *)&or_size_3);
          std::__cxx11::string::~string((string *)&or_size_3);
          std::allocator<char>::~allocator((allocator<char> *)&local_199);
          if (bVar3) {
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            uVar4 = anon_unknown.dwarf_19776::fmp4_read_uint32((char *)pvVar6);
            local_1a0 = uVar4 - l_first.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            anon_unknown.dwarf_19776::fmp4_write_uint32
                      (uVar4 - l_first.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                       (char *)pvVar6);
          }
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (moov_in,local_128);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&or_size_4,"minf",&local_1c1);
          bVar3 = compare_4cc((char *)pvVar6,(string *)&or_size_4);
          std::__cxx11::string::~string((string *)&or_size_4);
          std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
          if (bVar3) {
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            uVar4 = anon_unknown.dwarf_19776::fmp4_read_uint32((char *)pvVar6);
            local_1c8 = uVar4 - l_first.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            anon_unknown.dwarf_19776::fmp4_write_uint32
                      (uVar4 - l_first.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                       (char *)pvVar6);
          }
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (moov_in,local_128);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&or_size_5,"mdia",&local_1e9);
          bVar3 = compare_4cc((char *)pvVar6,(string *)&or_size_5);
          std::__cxx11::string::~string((string *)&or_size_5);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
          if (bVar3) {
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            uVar4 = anon_unknown.dwarf_19776::fmp4_read_uint32((char *)pvVar6);
            local_1f0 = uVar4 - l_first.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            anon_unknown.dwarf_19776::fmp4_write_uint32
                      (uVar4 - l_first.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                       (char *)pvVar6);
          }
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (moov_in,local_128);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&or_size_6,"trak",&local_211);
          bVar3 = compare_4cc((char *)pvVar6,(string *)&or_size_6);
          std::__cxx11::string::~string((string *)&or_size_6);
          std::allocator<char>::~allocator((allocator<char> *)&local_211);
          if (bVar3) {
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            uVar4 = anon_unknown.dwarf_19776::fmp4_read_uint32((char *)pvVar6);
            local_218 = uVar4 - l_first.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            anon_unknown.dwarf_19776::fmp4_write_uint32
                      (uVar4 - l_first.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                       (char *)pvVar6);
          }
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (moov_in,local_128);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&or_size_7,"moov",&local_239);
          bVar3 = compare_4cc((char *)pvVar6,(string *)&or_size_7);
          std::__cxx11::string::~string((string *)&or_size_7);
          std::allocator<char>::~allocator((allocator<char> *)&local_239);
          if (bVar3) {
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            uVar4 = anon_unknown.dwarf_19776::fmp4_read_uint32((char *)pvVar6);
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (moov_in,local_128 - 4);
            anon_unknown.dwarf_19776::fmp4_write_uint32
                      (uVar4 - l_first.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                       (char *)pvVar6);
          }
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (moov_in,local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"urim",&local_71);
    bVar3 = compare_4cc((char *)pvVar6,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if (bVar3) {
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_50 - 4);
      local_88 = anon_unknown.dwarf_19776::fmp4_read_uint32((char *)pvVar6);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_50 - 4);
      anon_unknown.dwarf_19776::fmp4_write_uint32(0x10,(char *)pvVar6);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_50);
      *pvVar6 = 'e';
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_50 + 1);
      *pvVar6 = 'v';
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_50 + 2);
      *pvVar6 = 't';
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (moov_in,local_50 + 3);
      *pvVar6 = 'e';
      l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = local_88 - 0x10;
      local_a8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(moov_in);
      local_c0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(moov_in);
      local_b8 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_c0,local_50);
      local_b0 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_b8,0xc);
      std::allocator<unsigned_char>::allocator(&local_c1);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a0,local_a8,local_b0,
                 &local_c1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_a0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a0);
      std::allocator<unsigned_char>::~allocator(&local_c1);
      local_100._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(moov_in);
      local_f8 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_100,local_50);
      local_f0 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_f8,(ulong)local_88);
      local_e8 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator-(&local_f0,4);
      local_108._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(moov_in);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&l_diff + 7));
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_e0,local_e8,local_108
                 ,(allocator<unsigned_char> *)((long)&l_diff + 7));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k,&local_e0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_e0);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&l_diff + 7));
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(moov_in);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &l_last.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k);
      i = ((sVar5 - sVar7) - sVar8) -
          (ulong)l_first.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
      goto LAB_001083fc;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

void event_track::set_evte(std::vector<uint8_t>& moov_in)
{
	uint32_t size_diff = 0;

	std::vector<uint8_t> l_first;
	std::vector<uint8_t> l_last;

	// find the uri box containing the description of the urn, caerfull only use for the enclosed mdat box in the source code
	for (std::size_t k = 0; k < moov_in.size() - 16; k++)
	{
		if (compare_4cc((char *)&moov_in[k], std::string("urim")))
		{
			//cout << "urim box found" << endl;
			uint32_t or_size = fmp4_read_uint32((char *)&moov_in[k - 4]);
			fmp4_write_uint32(16, (char *)&moov_in[k - 4]);

			moov_in[k]     = 'e';
			moov_in[k + 1] = 'v';
			moov_in[k + 2] = 't';
			moov_in[k + 3] = 'e';

			size_diff = (uint32_t)(or_size - 16);

			// first part of the string
			l_first = std::vector<uint8_t>(moov_in.begin(), moov_in.begin() + k + 12);
			// last part of the string
			l_last = std::vector<uint8_t>(moov_in.begin() + k + or_size - 4, moov_in.end());

			size_t l_diff = moov_in.size() - l_first.size() - l_last.size() - size_diff;

			break;
		}
	}

	// new string representing the moov_box 
	if (size_diff != 0)
	{
		// cout << "scheme size difference is: " << size_diff << endl;

		moov_in.resize(l_first.size());
		moov_in.reserve(moov_in.size() + l_last.size() + 1);

		for (std::size_t i = 0; i < l_last.size(); i++)
			moov_in.push_back(l_last[i]);

		for (std::size_t i = 0; i < moov_in.size(); i++)
		{

			if (compare_4cc((char *)&moov_in[i], std::string("stsd")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("stbl")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("uri ")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}

			if (compare_4cc((char *)&moov_in[i], std::string("minf")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("mdia")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("trak")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("moov")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
		}
	}
}